

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.h
# Opt level: O0

void __thiscall
Blip_Synth<12,_15>::offset_resampled
          (Blip_Synth<12,_15> *this,blip_resampled_time_t time,int delta,Blip_Buffer *blip_buf)

{
  buf_t_ *pbVar1;
  imp_t *piVar2;
  int iVar3;
  uint uVar4;
  short *psVar5;
  uint uVar6;
  imp_t *imp;
  int mid;
  int rev;
  int fwd;
  int phase;
  blip_long *buf;
  Blip_Buffer *blip_buf_local;
  int delta_local;
  blip_resampled_time_t time_local;
  Blip_Synth<12,_15> *this_local;
  
  iVar3 = (this->impl).delta_factor * delta;
  pbVar1 = blip_buf->buffer_;
  uVar6 = time >> 0x10;
  uVar4 = time >> 10 & 0x3f;
  psVar5 = (short *)((long)this + (long)(int)uVar4 * -2 + 0xa8);
  pbVar1[(ulong)uVar6 + 2] = *psVar5 * iVar3 + pbVar1[(ulong)uVar6 + 2];
  pbVar1[(ulong)uVar6 + 3] = psVar5[0x40] * iVar3 + pbVar1[(ulong)uVar6 + 3];
  pbVar1[(ulong)uVar6 + 4] = psVar5[0x80] * iVar3 + pbVar1[(ulong)uVar6 + 4];
  pbVar1[(ulong)uVar6 + 5] = psVar5[0xc0] * iVar3 + pbVar1[(ulong)uVar6 + 5];
  pbVar1[(ulong)uVar6 + 6] = psVar5[0x100] * iVar3 + pbVar1[(ulong)uVar6 + 6];
  pbVar1[(ulong)uVar6 + 7] = psVar5[0x140] * iVar3 + pbVar1[(ulong)uVar6 + 7];
  piVar2 = this->impulses + (int)uVar4;
  pbVar1[(ulong)uVar6 + 8] = piVar2[0x140] * iVar3 + pbVar1[(ulong)uVar6 + 8];
  pbVar1[(ulong)uVar6 + 9] = piVar2[0x100] * iVar3 + pbVar1[(ulong)uVar6 + 9];
  pbVar1[(ulong)uVar6 + 10] = piVar2[0xc0] * iVar3 + pbVar1[(ulong)uVar6 + 10];
  pbVar1[(ulong)uVar6 + 0xb] = piVar2[0x80] * iVar3 + pbVar1[(ulong)uVar6 + 0xb];
  pbVar1[(ulong)uVar6 + 0xc] = piVar2[0x40] * iVar3 + pbVar1[(ulong)uVar6 + 0xc];
  pbVar1[(ulong)uVar6 + 0xd] = *piVar2 * iVar3 + pbVar1[(ulong)uVar6 + 0xd];
  return;
}

Assistant:

inline void Blip_Synth<quality,range>::offset_resampled( blip_resampled_time_t time,
		int delta, Blip_Buffer* blip_buf ) const
{
	// Fails if time is beyond end of Blip_Buffer, due to a bug in caller code or the
	// need for a longer buffer as set by set_sample_rate().
	assert( (blip_long) (time >> BLIP_BUFFER_ACCURACY) < blip_buf->buffer_size_ );
	delta *= impl.delta_factor;
	blip_long* BLIP_RESTRICT buf = blip_buf->buffer_ + (time >> BLIP_BUFFER_ACCURACY);
	int phase = (int) (time >> (BLIP_BUFFER_ACCURACY - BLIP_PHASE_BITS) & (blip_res - 1));

#if BLIP_BUFFER_FAST
	blip_long left = buf [0] + delta;
	
	// Kind of crappy, but doing shift after multiply results in overflow.
	// Alternate way of delaying multiply by delta_factor results in worse
	// sub-sample resolution.
	blip_long right = (delta >> BLIP_PHASE_BITS) * phase;
	left  -= right;
	right += buf [1];
	
	buf [0] = left;
	buf [1] = right;
#else

	int const fwd = (blip_widest_impulse_ - quality) / 2;
	int const rev = fwd + quality - 2;
	int const mid = quality / 2 - 1;
	
	imp_t const* BLIP_RESTRICT imp = impulses + blip_res - phase;
	
	#if defined (_M_IX86) || defined (_M_IA64) || defined (__i486__) || \
			defined (__x86_64__) || defined (__ia64__) || defined (__i386__)
	
	// straight forward implementation resulted in better code on GCC for x86
	
	#define ADD_IMP( out, in ) \
		buf [out] += (blip_long) imp [blip_res * (in)] * delta
	
	#define BLIP_FWD( i ) {\
		ADD_IMP( fwd     + i, i     );\
		ADD_IMP( fwd + 1 + i, i + 1 );\
	}
	#define BLIP_REV( r ) {\
		ADD_IMP( rev     - r, r + 1 );\
		ADD_IMP( rev + 1 - r, r     );\
	}

		BLIP_FWD( 0 )
		if ( quality > 8  ) BLIP_FWD( 2 )
		if ( quality > 12 ) BLIP_FWD( 4 )
		{
			ADD_IMP( fwd + mid - 1, mid - 1 );
			ADD_IMP( fwd + mid    , mid     );
			imp = impulses + phase;
		}
		if ( quality > 12 ) BLIP_REV( 6 )
		if ( quality > 8  ) BLIP_REV( 4 )
		BLIP_REV( 2 )
		
		ADD_IMP( rev    , 1 );
		ADD_IMP( rev + 1, 0 );
		
	#else
	
	// for RISC processors, help compiler by reading ahead of writes
	
	#define BLIP_FWD( i ) {\
		blip_long t0 =                       i0 * delta + buf [fwd     + i];\
		blip_long t1 = imp [blip_res * (i + 1)] * delta + buf [fwd + 1 + i];\
		i0 =           imp [blip_res * (i + 2)];\
		buf [fwd     + i] = t0;\
		buf [fwd + 1 + i] = t1;\
	}
	#define BLIP_REV( r ) {\
		blip_long t0 =                 i0 * delta + buf [rev     - r];\
		blip_long t1 = imp [blip_res * r] * delta + buf [rev + 1 - r];\
		i0 =           imp [blip_res * (r - 1)];\
		buf [rev     - r] = t0;\
		buf [rev + 1 - r] = t1;\
	}
		
		blip_long i0 = *imp;
		BLIP_FWD( 0 )
		if ( quality > 8  ) BLIP_FWD( 2 )
		if ( quality > 12 ) BLIP_FWD( 4 )
		{
			blip_long t0 =                   i0 * delta + buf [fwd + mid - 1];
			blip_long t1 = imp [blip_res * mid] * delta + buf [fwd + mid    ];
			imp = impulses + phase;
			i0 = imp [blip_res * mid];
			buf [fwd + mid - 1] = t0;
			buf [fwd + mid    ] = t1;
		}
		if ( quality > 12 ) BLIP_REV( 6 )
		if ( quality > 8  ) BLIP_REV( 4 )
		BLIP_REV( 2 )
		
		blip_long t0 =   i0 * delta + buf [rev    ];
		blip_long t1 = *imp * delta + buf [rev + 1];
		buf [rev    ] = t0;
		buf [rev + 1] = t1;
	#endif
	
#endif
}